

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O0

size_t __thiscall
webrtc::WavReader::ReadSamples(WavReader *this,size_t num_samples,int16_t *samples)

{
  int iVar1;
  unsigned_long *puVar2;
  ostream *poVar3;
  FatalMessage local_340;
  string *local_1c8;
  string *_result;
  byte local_1a9;
  FatalMessage local_1a8;
  FatalMessageVoidify local_29;
  int16_t *local_28;
  size_t read;
  int16_t *samples_local;
  size_t num_samples_local;
  WavReader *this_local;
  
  read = (size_t)samples;
  samples_local = (int16_t *)num_samples;
  num_samples_local = (size_t)this;
  puVar2 = std::min<unsigned_long>((unsigned_long *)&samples_local,&this->num_samples_remaining_);
  samples_local = (int16_t *)*puVar2;
  local_28 = (int16_t *)fread((void *)read,2,(size_t)samples_local,(FILE *)this->file_handle_);
  local_1a9 = 0;
  if ((local_28 != samples_local) && (iVar1 = feof((FILE *)this->file_handle_), iVar1 == 0)) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_29);
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x58);
    local_1a9 = 1;
    poVar3 = rtc::FatalMessage::stream(&local_1a8);
    poVar3 = std::operator<<(poVar3,"Check failed: read == num_samples || feof(file_handle_)");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    rtc::FatalMessageVoidify::operator&(&local_29,poVar3);
  }
  if ((local_1a9 & 1) == 0) {
    local_1c8 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_28,&this->num_samples_remaining_,
                           "read <= num_samples_remaining_");
    if (local_1c8 == (string *)0x0) {
      this->num_samples_remaining_ = this->num_samples_remaining_ - (long)local_28;
      return (size_t)local_28;
    }
    rtc::FatalMessage::FatalMessage
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x59,local_1c8);
    rtc::FatalMessage::stream(&local_340);
    rtc::FatalMessage::~FatalMessage(&local_340);
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

size_t WavReader::ReadSamples(size_t num_samples, int16_t* samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to big-endian when reading from WAV file"
#endif
  // There could be metadata after the audio; ensure we don't read it.
  num_samples = std::min(num_samples, num_samples_remaining_);
  const size_t read =
      fread(samples, sizeof(*samples), num_samples, file_handle_);
  // If we didn't read what was requested, ensure we've reached the EOF.
  RTC_CHECK(read == num_samples || feof(file_handle_));
  RTC_CHECK_LE(read, num_samples_remaining_);
  num_samples_remaining_ -= read;
  return read;
}